

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::forward_int8_x86
          (ConvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  void *pvVar7;
  uint *puVar8;
  float *pfVar9;
  Layer *pLVar10;
  size_t sVar11;
  float fVar12;
  ulong uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint _elempack;
  undefined8 uVar17;
  Option OVar18;
  undefined1 uVar19;
  long lVar20;
  int iVar21;
  void *pvVar22;
  void *pvVar23;
  int remain_3;
  int iVar24;
  undefined4 *puVar25;
  undefined1 *puVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  _Vector_base<float,_std::allocator<float>_> *this_00;
  long lVar33;
  undefined1 (*pauVar34) [16];
  undefined1 (*pauVar35) [16];
  float *pfVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  void *pvVar40;
  void *pvVar41;
  int k;
  uint _elempack_00;
  ulong uVar42;
  int iVar43;
  uint uVar44;
  ulong uVar45;
  int g;
  uint uVar46;
  ulong uVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  float fVar80;
  float fVar81;
  undefined4 uVar82;
  undefined1 auVar83 [16];
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  __m128 max;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [12];
  undefined1 in_ZMM4 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  __m128 pos;
  undefined1 auVar128 [16];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar134 [64];
  ulong local_340;
  float *local_310;
  byte local_300;
  long local_2f8;
  Mat local_2e8;
  size_type local_298;
  ulong local_290;
  Option opt_q;
  float top_rescale;
  int iStack_234;
  Allocator *pAStack_230;
  Allocator *pAStack_228;
  int iStack_220;
  undefined4 uStack_21c;
  Allocator *pAStack_218;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  int iStack_200;
  undefined4 uStack_1fc;
  size_t local_1f8;
  pointer local_1f0;
  undefined4 *local_1e8;
  undefined4 *local_1e0;
  void *local_1d8;
  long local_1d0;
  ulong local_1c8;
  float scale_out;
  undefined4 uStack_1bc;
  int *local_1b8;
  Allocator *local_1b0;
  int local_1a8;
  long *local_1a0;
  int local_198;
  bool bStack_194;
  bool bStack_193;
  bool bStack_192;
  bool bStack_191;
  int iStack_190;
  bool bStack_18c;
  bool bStack_18b;
  bool bStack_18a;
  bool bStack_189;
  int local_188;
  ulong local_180;
  Mat local_178;
  pointer local_128;
  Mat m_1;
  _Vector_base<float,_std::allocator<float>_> local_d8;
  _Vector_base<float,_std::allocator<float>_> local_c0;
  _Vector_base<float,_std::allocator<float>_> local_a8;
  _Vector_base<float,_std::allocator<float>_> local_90;
  Option opt_g;
  undefined1 auVar66 [16];
  undefined1 auVar62 [16];
  
  auVar49 = in_ZMM8._0_16_;
  max = in_ZMM4._0_16_;
  local_178.c = bottom_blob->c;
  local_178.elempack = bottom_blob->elempack;
  local_178.elemsize = bottom_blob->elemsize;
  iVar24 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar43 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar28 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar39 = (this->super_ConvolutionDepthWise).dilation_h;
  piVar5 = bottom_blob->refcount;
  local_178.data = bottom_blob->data;
  local_178.refcount = bottom_blob->refcount;
  local_178.allocator = bottom_blob->allocator;
  local_178.dims = bottom_blob->dims;
  local_178.w = bottom_blob->w;
  local_178.h = bottom_blob->h;
  local_178.d = bottom_blob->d;
  local_178.cstep = bottom_blob->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  if (local_178.elempack == 0 || ((int)local_178.elemsize * 8) / local_178.elempack != 8) {
    iVar27 = local_178.elempack * local_178.c;
    iVar30 = (this->super_ConvolutionDepthWise).group;
    local_2e8.cstep = 0;
    local_2e8.data = (undefined4 *)0x0;
    local_2e8.refcount._0_4_ = 0;
    local_2e8.refcount._4_4_ = 0;
    local_2e8.elemsize = 0;
    local_2e8.elempack = 0;
    local_2e8.allocator = (Allocator *)0x0;
    local_2e8.dims = 0;
    local_2e8.w = 0;
    local_2e8.h = 0;
    local_2e8.d = 0;
    local_2e8.c = 0;
    uVar45 = 0;
    Mat::create(&local_2e8,iVar27,4,(Allocator *)0x0);
    iVar21 = -100;
    iVar27 = iVar27 / iVar30;
    uVar44 = (this->super_ConvolutionDepthWise).group;
    if (iVar27 < 1) {
      iVar27 = 0;
    }
    pvVar6 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
    puVar25 = (undefined4 *)local_2e8.data;
    uVar47 = (ulong)uVar44;
    if ((int)uVar44 < 1) {
      uVar47 = uVar45;
    }
    for (; uVar45 != uVar47; uVar45 = uVar45 + 1) {
      uVar82 = *(undefined4 *)((long)pvVar6 + uVar45 * 4);
      iVar30 = iVar27;
      while (bVar48 = iVar30 != 0, iVar30 = iVar30 + -1, bVar48) {
        *puVar25 = uVar82;
        puVar25 = puVar25 + 1;
      }
    }
    auVar79 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar79 = vmovdqu64_avx512f(auVar79);
    opt_q._16_48_ = auVar79._16_48_;
    opt_q._0_8_ = auVar79._0_8_;
    opt_q.blob_allocator = opt->workspace_allocator;
    in_ZMM4 = ZEXT1664((undefined1  [16])max);
    in_ZMM8 = ZEXT1664(auVar49);
    quantize_to_int8(bottom_blob,&local_178,&local_2e8,&opt_q);
    bVar48 = local_178.data == (void *)0x0;
    lVar31 = (long)local_178.c * local_178.cstep;
    piVar5 = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_2e8.allocator == (Allocator *)0x0) {
          free(local_2e8.data);
        }
        else {
          (*(local_2e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (bVar48 || lVar31 == 0) goto LAB_003a71c8;
  }
  local_2e8.cstep = 0;
  local_2e8.data = (undefined4 *)0x0;
  local_2e8.refcount._0_4_ = 0;
  local_2e8.refcount._4_4_ = 0;
  local_2e8.elemsize = 0;
  local_2e8.elempack = 0;
  local_2e8.allocator = (Allocator *)0x0;
  local_2e8.dims = 0;
  local_2e8.w = 0;
  local_2e8.h = 0;
  local_2e8.d = 0;
  local_2e8.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,&local_178,&local_2e8,opt);
  uVar44 = local_2e8.c;
  iVar27 = local_2e8.w;
  iVar30 = local_2e8.elempack;
  iVar21 = -100;
  if (((undefined4 *)local_2e8.data != (undefined4 *)0x0) &&
     (local_2e8.cstep * (long)local_2e8.c != 0)) {
    iVar24 = (~((iVar24 + -1) * iVar28) + local_2e8.w) / (this->super_ConvolutionDepthWise).stride_w
    ;
    iVar43 = (~((iVar43 + -1) * iVar39) + local_2e8.h) / (this->super_ConvolutionDepthWise).stride_h
    ;
    iVar28 = iVar24 + 1;
    iVar39 = iVar43 + 1;
    uVar46 = local_2e8.elempack * local_2e8.c;
    if ((uVar46 == (this->super_ConvolutionDepthWise).group) &&
       (uVar46 == (this->super_ConvolutionDepthWise).num_output)) {
      sVar11 = 8;
      if (opt->use_packing_layout == false) {
        sVar11 = 1;
      }
      if ((uVar46 & 7) != 0) {
        sVar11 = 1;
      }
      iVar2 = (this->super_ConvolutionDepthWise).int8_scale_term;
      iVar29 = (int)sVar11;
      uVar45 = (ulong)(uint)(iVar29 * 4);
      if (100 < iVar2) {
        uVar45 = sVar11;
      }
      Mat::create(top_blob,iVar28,iVar39,(int)uVar46 / iVar29,uVar45,iVar29,opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar21 = 0;
        if (iVar30 == 1) {
          iVar28 = (this->super_ConvolutionDepthWise).kernel_w;
          iVar39 = (this->super_ConvolutionDepthWise).kernel_h;
          iVar30 = (this->super_ConvolutionDepthWise).stride_w;
          iVar29 = (this->super_ConvolutionDepthWise).stride_h;
          iVar3 = (this->super_ConvolutionDepthWise).dilation_w;
          iVar4 = (this->super_ConvolutionDepthWise).dilation_h;
          uVar44 = (this->super_ConvolutionDepthWise).activation_type;
          if ((1 < uVar44 || (iVar4 != 1 || iVar3 != 1)) ||
              ((iVar29 != 1 || iVar30 != 1) || (iVar39 != 3 || iVar28 != 3))) {
            if (((iVar29 != 2 || iVar30 != 2) || 1 < uVar44) ||
                ((iVar39 != 3 || iVar28 != 3) || (iVar3 != 1 || iVar4 != 1))) {
              uVar44 = iVar39 * iVar28;
              local_298 = (size_type)(int)uVar44;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&opt_q,local_298,
                         (allocator_type *)&top_rescale);
              iVar28 = (this->super_ConvolutionDepthWise).dilation_h;
              uVar17 = opt_q._0_8_;
              iVar39 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar30 = (this->super_ConvolutionDepthWise).dilation_w * iVar39;
              lVar31 = 0;
              iVar21 = 0;
              for (iVar29 = 0; iVar29 < (this->super_ConvolutionDepthWise).kernel_h;
                  iVar29 = iVar29 + 1) {
                for (lVar33 = 0; (int)lVar33 < iVar39; lVar33 = lVar33 + 1) {
                  *(int *)((long)(int)lVar31 * 4 + opt_q._0_8_ + lVar33 * 4) = iVar21;
                  iVar21 = iVar21 + (this->super_ConvolutionDepthWise).dilation_w;
                  iVar39 = (this->super_ConvolutionDepthWise).kernel_w;
                }
                iVar21 = iVar21 + (iVar27 * iVar28 - iVar30);
                lVar31 = (int)lVar31 + lVar33;
              }
              local_2f8 = 0;
              if ((int)uVar44 < 1) {
                uVar44 = 0;
              }
              auVar79 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              for (uVar45 = 0; pvVar6 = local_2e8.data,
                  (long)uVar45 < (long)(this->super_ConvolutionDepthWise).group; uVar45 = uVar45 + 1
                  ) {
                pfVar36 = (float *)(top_blob->elemsize * uVar45 * top_blob->cstep +
                                   (long)top_blob->data);
                lVar33 = local_2e8.cstep * uVar45 * local_2e8.elemsize;
                lVar31 = (long)local_2e8.w * local_2e8.elemsize;
                pvVar7 = (this->weight_data_tm).data;
                local_310 = pfVar36;
                local_290 = uVar45;
                for (iVar28 = 0; iVar28 <= iVar43; iVar28 = iVar28 + 1) {
                  for (iVar39 = 0; iVar39 <= iVar24; iVar39 = iVar39 + 1) {
                    iVar30 = 0;
                    for (uVar47 = 0; uVar44 != uVar47; uVar47 = uVar47 + 1) {
                      iVar30 = iVar30 + (int)*(char *)((long)pvVar7 + uVar47 + local_2f8) *
                                        (int)*(char *)((long)pvVar6 +
                                                      (long)*(int *)(uVar17 + uVar47 * 4) +
                                                      (long)iVar28 *
                                                      (long)(this->super_ConvolutionDepthWise).
                                                            stride_h * lVar31 +
                                                      (long)iVar39 *
                                                      (long)(this->super_ConvolutionDepthWise).
                                                            stride_w + lVar33);
                    }
                    fVar81 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                              weight_data_int8_scales.data + uVar45 * 4);
                    fVar80 = 0.0;
                    if (fVar81 != 0.0) {
                      fVar80 = 1.0 / (fVar81 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                                bottom_blob_int8_scales.data +
                                                         uVar45 * 4));
                    }
                    fVar80 = fVar80 * (float)iVar30;
                    if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                      fVar80 = fVar80 + *(float *)((long)(this->super_ConvolutionDepthWise).
                                                         bias_data.data + uVar45 * 4);
                    }
                    auVar49 = ZEXT416((uint)fVar80);
                    fVar81 = fVar80;
                    switch((this->super_ConvolutionDepthWise).activation_type) {
                    case 1:
                      auVar49 = vmaxss_avx(auVar49,ZEXT416(0));
                      fVar81 = auVar49._0_4_;
                      break;
                    case 2:
                      uVar14 = vcmpss_avx512f(auVar49,ZEXT416(0),0xe);
                      bVar48 = (bool)((byte)uVar14 & 1);
                      fVar81 = (float)((uint)bVar48 * 0x3f800000 +
                                      (uint)!bVar48 *
                                      *(this->super_ConvolutionDepthWise).activation_params.data) *
                               fVar80;
                      break;
                    case 3:
                      puVar8 = (uint *)(this->super_ConvolutionDepthWise).activation_params.data;
                      fVar80 = (float)puVar8[1];
                      auVar49 = vmaxss_avx(auVar49,ZEXT416(*puVar8));
                      fVar81 = auVar49._0_4_;
                      if (fVar80 < auVar49._0_4_) {
                        fVar81 = fVar80;
                      }
                      break;
                    case 4:
                      auVar49 = vminss_avx(auVar49,SUB6416(ZEXT464(0x42b0c0a5),0));
                      uVar14 = vcmpss_avx512f(auVar49,ZEXT416(0xc2b0c0a5),1);
                      bVar48 = (bool)((byte)uVar14 & 1);
                      fVar81 = expf((float)((uint)bVar48 * 0x42b0c0a5 +
                                           (uint)!bVar48 * (auVar49._0_4_ ^ auVar79._0_4_)));
                      auVar79 = ZEXT1664(CONCAT412(0x80000000,
                                                   CONCAT48(0x80000000,0x8000000080000000)));
                      uVar45 = local_290;
                      fVar81 = 1.0 / (fVar81 + 1.0);
                      break;
                    case 5:
                      fVar81 = expf(fVar80);
                      fVar81 = logf(fVar81 + 1.0);
                      fVar81 = tanhf(fVar81);
                      auVar79 = ZEXT1664(CONCAT412(0x80000000,
                                                   CONCAT48(0x80000000,0x8000000080000000)));
                      fVar81 = fVar81 * fVar80;
                      break;
                    case 6:
                      pfVar9 = (float *)(this->super_ConvolutionDepthWise).activation_params.data;
                      fVar12 = *pfVar9;
                      fVar1 = pfVar9[1];
                      fVar84 = (float)((uint)fVar1 ^ auVar79._0_4_) / fVar12;
                      fVar81 = 0.0;
                      if ((fVar84 <= fVar80) && (fVar81 = fVar80, fVar80 <= fVar84 + 1.0 / fVar12))
                      {
                        auVar49 = vfmadd213ss_fma(ZEXT416((uint)fVar12),auVar49,ZEXT416((uint)fVar1)
                                                 );
                        fVar81 = auVar49._0_4_ * fVar80;
                      }
                    }
                    if (iVar2 < 0x65) {
                      *local_310 = fVar81;
                      local_310 = local_310 + 1;
                    }
                    else {
                      fVar81 = fVar81 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                         top_blob_int8_scales.data + uVar45 * 4);
                      auVar49._8_4_ = 0x3effffff;
                      auVar49._0_8_ = 0x3effffff3effffff;
                      auVar49._12_4_ = 0x3effffff;
                      auVar49 = vpternlogd_avx512vl(auVar49,ZEXT416((uint)fVar81),auVar79._0_16_,
                                                    0xf8);
                      auVar49 = ZEXT416((uint)(fVar81 + auVar49._0_4_));
                      auVar49 = vroundss_avx(auVar49,auVar49,0xb);
                      iVar30 = (int)auVar49._0_4_;
                      if (iVar30 < -0x7e) {
                        iVar30 = -0x7f;
                      }
                      uVar19 = (undefined1)iVar30;
                      if (0x7e < iVar30) {
                        uVar19 = 0x7f;
                      }
                      *(undefined1 *)pfVar36 = uVar19;
                      pfVar36 = (float *)((long)pfVar36 + 1);
                    }
                  }
                }
                local_2f8 = local_2f8 + local_298;
              }
              goto LAB_003a66e2;
            }
            if (iVar2 < 0x65) {
              opt_q.workspace_allocator = (Allocator *)0x0;
              opt_q = (Option)(ZEXT4864((undefined1  [48])opt_q._16_48_) << 0x80);
              lVar31 = 0;
              while( true ) {
                auVar109 = in_ZMM4._4_12_;
                if ((this->super_ConvolutionDepthWise).group <= lVar31) break;
                _top_rescale = (void *)CONCAT44(iStack_234,
                                                1.0 / (*(float *)((long)(this->
                                                  super_ConvolutionDepthWise).
                                                  weight_data_int8_scales.data + lVar31 * 4) *
                                                  *(float *)((long)(this->super_ConvolutionDepthWise
                                                                   ).bottom_blob_int8_scales.data +
                                                            lVar31 * 4)));
                std::vector<float,_std::allocator<float>_>::push_back
                          ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
                lVar31 = lVar31 + 1;
              }
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)&local_d8,
                         (vector<float,_std::allocator<float>_> *)&opt_q);
              iVar24 = top_blob->w;
              iVar43 = top_blob->h;
              pvVar6 = (this->super_ConvolutionDepthWise).bias_data.data;
              pvVar7 = (this->weight_data_tm).data;
              iVar28 = top_blob->d;
              local_290 = top_blob->elemsize;
              lVar31 = top_blob->cstep * local_290;
              local_298 = (long)iVar43 * (long)iVar24;
              local_1c8 = local_290 * local_298 + 0xf & 0xfffffffffffffff0;
              local_1d0 = local_2e8.elemsize * local_2e8.cstep;
              iVar39 = 0;
              if (0 < iVar43) {
                iVar39 = iVar43;
              }
              local_1d8 = top_blob->data;
              uVar44 = top_blob->c;
              if (top_blob->c < 1) {
                uVar44 = 0;
              }
              lVar33 = (long)((local_2e8.w - iVar24) * 2);
              iVar43 = top_blob->dims;
              local_1e0 = (undefined4 *)CONCAT44(local_1e0._4_4_,iVar43);
              local_1e8 = (undefined4 *)local_2e8.data;
              local_1f0 = (pointer)((long)local_2e8.w * 2);
              local_128 = local_d8._M_impl.super__Vector_impl_data._M_start;
              pvVar41 = local_1d8;
              for (uVar45 = 0; uVar45 != uVar44; uVar45 = uVar45 + 1) {
                iVar30 = (int)(local_1c8 / local_290);
                if (iVar43 == 4) {
                  iVar30 = (int)local_298;
                }
                if (pvVar6 == (void *)0x0) {
                  uVar82 = 0;
                }
                else {
                  uVar82 = *(undefined4 *)((long)pvVar6 + uVar45 * 4);
                }
                fVar81 = local_d8._M_impl.super__Vector_impl_data._M_start[uVar45];
                iVar30 = iVar30 * iVar28;
                if (iVar30 < 1) {
                  iVar30 = 0;
                }
                for (lVar20 = 0; iVar30 != (int)lVar20; lVar20 = lVar20 + 1) {
                  *(undefined4 *)((long)pvVar41 + lVar20 * 4) = uVar82;
                }
                puVar25 = (undefined4 *)(local_1d0 * uVar45 + (long)local_2e8.data);
                lVar20 = (long)puVar25 + (long)local_2e8.w;
                lVar37 = (long)puVar25 + (long)local_1f0;
                pvVar40 = (void *)(lVar31 * uVar45 + (long)local_1d8);
                for (iVar30 = 0; iVar30 != iVar39; iVar30 = iVar30 + 1) {
                  lVar38 = 0;
                  pvVar23 = pvVar40;
                  for (iVar27 = iVar24; 0 < iVar27; iVar27 = iVar27 + -1) {
                    auVar49 = vpinsrb_avx(ZEXT216(*(ushort *)((long)puVar25 + lVar38)),
                                          (uint)*(byte *)((long)puVar25 + lVar38 + 2),2);
                    auVar49 = vpinsrb_avx(auVar49,(uint)*(byte *)(lVar20 + lVar38),3);
                    auVar49 = vpinsrb_avx(auVar49,(uint)*(byte *)(lVar20 + 1 + lVar38),4);
                    auVar49 = vpinsrb_avx(auVar49,(uint)*(byte *)(lVar20 + 2 + lVar38),5);
                    auVar49 = vpinsrb_avx(auVar49,(uint)*(byte *)(lVar37 + lVar38),6);
                    auVar49 = vpinsrb_avx(auVar49,(uint)*(byte *)(lVar37 + 1 + lVar38),7);
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ = *(ulong *)((long)pvVar7 + uVar45 * 9);
                    auVar50 = vpmovsxbw_avx(auVar50);
                    auVar49 = vpmovsxbw_avx(auVar49);
                    auVar49 = vpmaddwd_avx(auVar50,auVar49);
                    auVar49 = vphaddd_avx((undefined1  [16])0x0,auVar49);
                    auVar49 = vphaddd_avx(auVar49,auVar49);
                    auVar49 = vphaddd_avx(auVar49,auVar49);
                    auVar51._0_4_ =
                         (float)(auVar49._0_4_ +
                                (int)*(char *)((long)pvVar7 + uVar45 * 9 + 8) *
                                (int)*(char *)(lVar37 + 2 + lVar38));
                    auVar51._4_12_ = auVar109;
                    auVar49 = vfmadd213ss_fma(auVar51,ZEXT416((uint)fVar81),
                                              ZEXT416(*(uint *)((long)pvVar40 + lVar38 * 2)));
                    *(int *)((long)pvVar40 + lVar38 * 2) = auVar49._0_4_;
                    pvVar23 = (void *)((long)pvVar23 + 4);
                    lVar38 = lVar38 + 2;
                  }
                  puVar25 = (undefined4 *)((long)puVar25 + lVar38 + lVar33);
                  lVar20 = lVar20 + lVar33 + lVar38;
                  lVar37 = lVar37 + lVar33 + lVar38;
                  pvVar40 = pvVar23;
                }
                pvVar41 = (void *)((long)pvVar41 + lVar31);
              }
              this_00 = &local_d8;
            }
            else {
              opt_q._0_24_ = ZEXT1624((undefined1  [16])0x0);
              for (lVar31 = 0; auVar109 = in_ZMM8._4_12_,
                  lVar31 < (this->super_ConvolutionDepthWise).group; lVar31 = lVar31 + 1) {
                fVar81 = *(float *)((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales
                                          .data + lVar31 * 4);
                fVar80 = 0.0;
                if (fVar81 != 0.0) {
                  fVar80 = 1.0 / (fVar81 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                            bottom_blob_int8_scales.data +
                                                     lVar31 * 4));
                }
                _top_rescale = (void *)CONCAT44(iStack_234,fVar80);
                _scale_out = (void *)CONCAT44(uStack_1bc,
                                              *(undefined4 *)
                                               ((long)(this->super_ConvolutionDepthWise).
                                                      top_blob_int8_scales.data + lVar31 * 4));
                std::vector<float,_std::allocator<float>_>::push_back
                          ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
                std::vector<float,_std::allocator<float>_>::push_back
                          ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)&local_c0,
                         (vector<float,_std::allocator<float>_> *)&opt_q);
              iVar24 = top_blob->w;
              pvVar6 = (this->super_ConvolutionDepthWise).bias_data.data;
              pvVar7 = (this->weight_data_tm).data;
              lVar31 = (long)((local_2e8.w - iVar24) * 2);
              uVar45 = 0;
              iVar43 = top_blob->h;
              if (top_blob->h < 1) {
                iVar43 = 0;
              }
              uVar47 = (ulong)(uint)top_blob->c;
              if (top_blob->c < 1) {
                uVar47 = uVar45;
              }
              auVar52._8_4_ = 0x3effffff;
              auVar52._0_8_ = 0x3effffff3effffff;
              auVar52._12_4_ = 0x3effffff;
              auVar53._8_4_ = 0x80000000;
              auVar53._0_8_ = 0x8000000080000000;
              auVar53._12_4_ = 0x80000000;
              for (; uVar45 != uVar47; uVar45 = uVar45 + 1) {
                if (pvVar6 == (void *)0x0) {
                  auVar49 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar49 = ZEXT416(*(uint *)((long)pvVar6 + uVar45 * 4));
                }
                puVar26 = (undefined1 *)
                          (top_blob->cstep * uVar45 * top_blob->elemsize + (long)top_blob->data);
                fVar81 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar45 * 2];
                fVar80 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar45 * 2 + 1];
                puVar25 = (undefined4 *)
                          (local_2e8.cstep * uVar45 * local_2e8.elemsize + (long)local_2e8.data);
                lVar33 = (long)puVar25 + (long)local_2e8.w;
                lVar20 = (long)puVar25 + (long)local_2e8.w * 2;
                for (iVar28 = 0; iVar28 != iVar43; iVar28 = iVar28 + 1) {
                  lVar37 = 0;
                  for (iVar39 = iVar24; 0 < iVar39; iVar39 = iVar39 + -1) {
                    auVar50 = vpinsrb_avx(ZEXT216(*(ushort *)((long)puVar25 + lVar37)),
                                          (uint)*(byte *)((long)puVar25 + lVar37 + 2),2);
                    auVar50 = vpinsrb_avx(auVar50,(uint)*(byte *)(lVar33 + lVar37),3);
                    auVar50 = vpinsrb_avx(auVar50,(uint)*(byte *)(lVar33 + 1 + lVar37),4);
                    auVar50 = vpinsrb_avx(auVar50,(uint)*(byte *)(lVar33 + 2 + lVar37),5);
                    auVar50 = vpinsrb_avx(auVar50,(uint)*(byte *)(lVar20 + lVar37),6);
                    auVar50 = vpinsrb_avx(auVar50,(uint)*(byte *)(lVar20 + 1 + lVar37),7);
                    auVar54._8_8_ = 0;
                    auVar54._0_8_ = *(ulong *)((long)pvVar7 + uVar45 * 9);
                    auVar51 = vpmovsxbw_avx(auVar54);
                    auVar50 = vpmovsxbw_avx(auVar50);
                    auVar50 = vpmaddwd_avx(auVar51,auVar50);
                    auVar50 = vphaddd_avx((undefined1  [16])0x0,auVar50);
                    auVar50 = vphaddd_avx(auVar50,auVar50);
                    auVar50 = vphaddd_avx(auVar50,auVar50);
                    auVar55._0_4_ =
                         (float)(auVar50._0_4_ +
                                (int)*(char *)((long)pvVar7 + uVar45 * 9 + 8) *
                                (int)*(char *)(lVar20 + 2 + lVar37));
                    auVar55._4_12_ = auVar109;
                    auVar50 = vfmadd213ss_fma(auVar55,ZEXT416((uint)fVar81),auVar49);
                    fVar12 = auVar50._0_4_ * fVar80;
                    auVar50 = vpternlogd_avx512vl(auVar52,ZEXT416((uint)fVar12),auVar53,0xf8);
                    auVar50 = ZEXT416((uint)(fVar12 + auVar50._0_4_));
                    auVar50 = vroundss_avx(auVar50,auVar50,0xb);
                    iVar30 = (int)auVar50._0_4_;
                    if (iVar30 < -0x7e) {
                      iVar30 = -0x7f;
                    }
                    uVar19 = (undefined1)iVar30;
                    if (0x7e < iVar30) {
                      uVar19 = 0x7f;
                    }
                    *puVar26 = uVar19;
                    puVar26 = puVar26 + 1;
                    lVar37 = lVar37 + 2;
                  }
                  puVar25 = (undefined4 *)((long)puVar25 + lVar37 + lVar31);
                  lVar33 = lVar33 + lVar31 + lVar37;
                  lVar20 = lVar20 + lVar31 + lVar37;
                }
              }
              this_00 = &local_c0;
            }
          }
          else if (iVar2 < 0x65) {
            opt_q.workspace_allocator = (Allocator *)0x0;
            opt_q = (Option)(ZEXT4864((undefined1  [48])opt_q._16_48_) << 0x80);
            lVar31 = 0;
            while( true ) {
              auVar109 = in_ZMM4._4_12_;
              if ((this->super_ConvolutionDepthWise).group <= lVar31) break;
              _top_rescale = (void *)CONCAT44(iStack_234,
                                              1.0 / (*(float *)((long)(this->
                                                  super_ConvolutionDepthWise).
                                                  weight_data_int8_scales.data + lVar31 * 4) *
                                                  *(float *)((long)(this->super_ConvolutionDepthWise
                                                                   ).bottom_blob_int8_scales.data +
                                                            lVar31 * 4)));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              lVar31 = lVar31 + 1;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_a8,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar24 = top_blob->w;
            iVar43 = top_blob->h;
            pvVar6 = (this->super_ConvolutionDepthWise).bias_data.data;
            pvVar7 = (this->weight_data_tm).data;
            iVar28 = top_blob->d;
            pvVar41 = top_blob->data;
            local_290 = top_blob->elemsize;
            lVar31 = top_blob->cstep * local_290;
            local_298 = (long)iVar43 * (long)iVar24;
            local_1d0 = local_2e8.elemsize * local_2e8.cstep;
            local_1c8 = local_290 * local_298 + 0xf & 0xfffffffffffffff0;
            iVar39 = 0;
            if (0 < iVar43) {
              iVar39 = iVar43;
            }
            iVar43 = top_blob->dims;
            local_1d8 = (void *)CONCAT44(local_1d8._4_4_,iVar43);
            uVar45 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar45 = 0;
            }
            local_1e0 = (undefined4 *)local_2e8.data;
            local_1e8 = (undefined4 *)((long)local_2e8.w * 2);
            local_1f0 = local_a8._M_impl.super__Vector_impl_data._M_start;
            pvVar40 = pvVar41;
            for (uVar47 = 0; uVar47 != uVar45; uVar47 = uVar47 + 1) {
              iVar30 = (int)(local_1c8 / local_290);
              if (iVar43 == 4) {
                iVar30 = (int)local_298;
              }
              if (pvVar6 == (void *)0x0) {
                uVar82 = 0;
              }
              else {
                uVar82 = *(undefined4 *)((long)pvVar6 + uVar47 * 4);
              }
              fVar81 = local_a8._M_impl.super__Vector_impl_data._M_start[uVar47];
              iVar30 = iVar30 * iVar28;
              if (iVar30 < 1) {
                iVar30 = 0;
              }
              for (lVar33 = 0; iVar30 != (int)lVar33; lVar33 = lVar33 + 1) {
                *(undefined4 *)((long)pvVar40 + lVar33 * 4) = uVar82;
              }
              puVar25 = (undefined4 *)(local_1d0 * uVar47 + (long)local_2e8.data);
              lVar33 = (long)local_2e8.w + (long)puVar25;
              lVar20 = (long)local_1e8 + (long)puVar25;
              pvVar23 = (void *)(lVar31 * uVar47 + (long)pvVar41);
              for (iVar30 = 0; iVar30 != iVar39; iVar30 = iVar30 + 1) {
                lVar37 = 0;
                pvVar22 = pvVar23;
                for (uVar32 = (long)iVar24; 0 < (int)uVar32; uVar32 = (ulong)((int)uVar32 - 1)) {
                  auVar49 = vpinsrb_avx(ZEXT216(*(ushort *)((long)puVar25 + lVar37)),
                                        (uint)*(byte *)((long)puVar25 + lVar37 + 2),2);
                  auVar49 = vpinsrb_avx(auVar49,(uint)*(byte *)(lVar33 + lVar37),3);
                  auVar49 = vpinsrb_avx(auVar49,(uint)*(byte *)(lVar33 + 1 + lVar37),4);
                  auVar49 = vpinsrb_avx(auVar49,(uint)*(byte *)(lVar33 + 2 + lVar37),5);
                  auVar49 = vpinsrb_avx(auVar49,(uint)*(byte *)(lVar20 + lVar37),6);
                  auVar49 = vpinsrb_avx(auVar49,(uint)*(byte *)(lVar20 + 1 + lVar37),7);
                  auVar60._8_8_ = 0;
                  auVar60._0_8_ = *(ulong *)((long)pvVar7 + uVar47 * 9);
                  auVar50 = vpmovsxbw_avx(auVar60);
                  auVar49 = vpmovsxbw_avx(auVar49);
                  auVar49 = vpmaddwd_avx(auVar50,auVar49);
                  auVar49 = vphaddd_avx((undefined1  [16])0x0,auVar49);
                  auVar49 = vphaddd_avx(auVar49,auVar49);
                  auVar49 = vphaddd_avx(auVar49,auVar49);
                  auVar61._0_4_ =
                       (float)(auVar49._0_4_ +
                              (int)*(char *)((long)pvVar7 + uVar47 * 9 + 8) *
                              (int)*(char *)(lVar20 + 2 + lVar37));
                  auVar61._4_12_ = auVar109;
                  auVar49 = vfmadd213ss_fma(auVar61,ZEXT416((uint)fVar81),
                                            ZEXT416(*(uint *)((long)pvVar23 + lVar37 * 4)));
                  *(int *)((long)pvVar23 + lVar37 * 4) = auVar49._0_4_;
                  pvVar22 = (void *)((long)pvVar22 + 4);
                  lVar37 = lVar37 + 1;
                }
                puVar25 = (undefined4 *)((long)puVar25 + lVar37 + 2);
                lVar33 = lVar33 + lVar37 + 2;
                lVar20 = lVar20 + lVar37 + 2;
                pvVar23 = pvVar22;
              }
              pvVar40 = (void *)((long)pvVar40 + lVar31);
            }
            this_00 = &local_a8;
          }
          else {
            opt_q._0_24_ = ZEXT1624((undefined1  [16])0x0);
            for (lVar31 = 0; auVar109 = in_ZMM8._4_12_,
                lVar31 < (this->super_ConvolutionDepthWise).group; lVar31 = lVar31 + 1) {
              fVar81 = *(float *)((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.
                                        data + lVar31 * 4);
              fVar80 = 0.0;
              if (fVar81 != 0.0) {
                fVar80 = 1.0 / (fVar81 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                          bottom_blob_int8_scales.data + lVar31 * 4)
                               );
              }
              _top_rescale = (void *)CONCAT44(iStack_234,fVar80);
              _scale_out = (void *)CONCAT44(uStack_1bc,
                                            *(undefined4 *)
                                             ((long)(this->super_ConvolutionDepthWise).
                                                    top_blob_int8_scales.data + lVar31 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_90,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar24 = top_blob->w;
            pvVar6 = (this->super_ConvolutionDepthWise).bias_data.data;
            pvVar7 = (this->weight_data_tm).data;
            uVar45 = 0;
            iVar43 = top_blob->h;
            if (top_blob->h < 1) {
              iVar43 = 0;
            }
            uVar47 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar47 = uVar45;
            }
            auVar56._8_4_ = 0x3effffff;
            auVar56._0_8_ = 0x3effffff3effffff;
            auVar56._12_4_ = 0x3effffff;
            auVar57._8_4_ = 0x80000000;
            auVar57._0_8_ = 0x8000000080000000;
            auVar57._12_4_ = 0x80000000;
            for (; uVar45 != uVar47; uVar45 = uVar45 + 1) {
              if (pvVar6 == (void *)0x0) {
                auVar49 = ZEXT816(0) << 0x40;
              }
              else {
                auVar49 = ZEXT416(*(uint *)((long)pvVar6 + uVar45 * 4));
              }
              pvVar41 = (void *)(top_blob->cstep * uVar45 * top_blob->elemsize +
                                (long)top_blob->data);
              fVar81 = local_90._M_impl.super__Vector_impl_data._M_start[uVar45 * 2];
              fVar80 = local_90._M_impl.super__Vector_impl_data._M_start[uVar45 * 2 + 1];
              puVar25 = (undefined4 *)
                        (local_2e8.cstep * uVar45 * local_2e8.elemsize + (long)local_2e8.data);
              lVar31 = (long)puVar25 + (long)local_2e8.w;
              lVar33 = (long)puVar25 + (long)local_2e8.w * 2;
              for (iVar28 = 0; iVar28 != iVar43; iVar28 = iVar28 + 1) {
                lVar20 = 0;
                for (iVar39 = iVar24; 0 < iVar39; iVar39 = iVar39 + -1) {
                  auVar50 = vpinsrb_avx(ZEXT216(*(ushort *)((long)puVar25 + lVar20)),
                                        (uint)*(byte *)((long)puVar25 + lVar20 + 2),2);
                  auVar50 = vpinsrb_avx(auVar50,(uint)*(byte *)(lVar31 + lVar20),3);
                  auVar50 = vpinsrb_avx(auVar50,(uint)*(byte *)(lVar31 + 1 + lVar20),4);
                  auVar50 = vpinsrb_avx(auVar50,(uint)*(byte *)(lVar31 + 2 + lVar20),5);
                  auVar50 = vpinsrb_avx(auVar50,(uint)*(byte *)(lVar33 + lVar20),6);
                  auVar50 = vpinsrb_avx(auVar50,(uint)*(byte *)(lVar33 + 1 + lVar20),7);
                  auVar116._8_8_ = 0;
                  auVar116._0_8_ = *(ulong *)((long)pvVar7 + uVar45 * 9);
                  auVar51 = vpmovsxbw_avx(auVar116);
                  auVar50 = vpmovsxbw_avx(auVar50);
                  auVar50 = vpmaddwd_avx(auVar51,auVar50);
                  auVar50 = vphaddd_avx((undefined1  [16])0x0,auVar50);
                  auVar50 = vphaddd_avx(auVar50,auVar50);
                  auVar50 = vphaddd_avx(auVar50,auVar50);
                  auVar117._0_4_ =
                       (float)(auVar50._0_4_ +
                              (int)*(char *)((long)pvVar7 + uVar45 * 9 + 8) *
                              (int)*(char *)(lVar33 + 2 + lVar20));
                  auVar117._4_12_ = auVar109;
                  auVar50 = vfmadd213ss_fma(auVar117,ZEXT416((uint)fVar81),auVar49);
                  fVar12 = auVar50._0_4_ * fVar80;
                  auVar50 = vpternlogd_avx512vl(auVar56,ZEXT416((uint)fVar12),auVar57,0xf8);
                  auVar50 = ZEXT416((uint)(fVar12 + auVar50._0_4_));
                  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
                  iVar30 = (int)auVar50._0_4_;
                  if (iVar30 < -0x7e) {
                    iVar30 = -0x7f;
                  }
                  uVar19 = (undefined1)iVar30;
                  if (0x7e < iVar30) {
                    uVar19 = 0x7f;
                  }
                  *(undefined1 *)((long)pvVar41 + lVar20) = uVar19;
                  lVar20 = lVar20 + 1;
                }
                puVar25 = (undefined4 *)((long)puVar25 + lVar20 + 2);
                lVar31 = lVar31 + lVar20 + 2;
                lVar33 = lVar33 + lVar20 + 2;
                pvVar41 = (void *)((long)pvVar41 + lVar20);
              }
            }
            this_00 = &local_90;
          }
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(this_00);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    ((_Vector_base<float,_std::allocator<float>_> *)&opt_q);
          pLVar10 = this->activation;
          if (pLVar10 != (Layer *)0x0) {
            (*pLVar10->_vptr_Layer[9])(pLVar10,top_blob,opt);
          }
        }
        else if (iVar30 == 8) {
          uVar45 = (long)(this->super_ConvolutionDepthWise).kernel_h *
                   (long)(this->super_ConvolutionDepthWise).kernel_w;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&opt_q,uVar45,
                     (allocator_type *)&top_rescale);
          iVar28 = (this->super_ConvolutionDepthWise).dilation_h;
          iVar39 = (this->super_ConvolutionDepthWise).kernel_w;
          iVar30 = (this->super_ConvolutionDepthWise).dilation_w * iVar39;
          iVar29 = 0;
          lVar31 = 0;
          for (iVar21 = 0; iVar21 < (this->super_ConvolutionDepthWise).kernel_h; iVar21 = iVar21 + 1
              ) {
            for (lVar33 = 0; (int)lVar33 < iVar39; lVar33 = lVar33 + 1) {
              *(int *)(opt_q._0_8_ + (long)(int)lVar31 * 4 + lVar33 * 4) = iVar29;
              iVar29 = iVar29 + (this->super_ConvolutionDepthWise).dilation_w;
              iVar39 = (this->super_ConvolutionDepthWise).kernel_w;
            }
            iVar29 = iVar29 + (iVar27 * iVar28 - iVar30);
            lVar31 = (int)lVar31 + lVar33;
          }
          iVar28 = 0;
          uVar47 = uVar45 & 0xffffffff;
          if ((int)uVar45 < 1) {
            uVar47 = 0;
          }
          if ((int)uVar44 < 1) {
            uVar44 = 0;
          }
          auVar79 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar83._8_4_ = 0x3f000000;
          auVar83._0_8_ = 0x3f0000003f000000;
          auVar83._12_4_ = 0x3f000000;
          auVar49 = vpbroadcastw_avx512vl(ZEXT216(0x7f));
          auVar50 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar133 = ZEXT1664(auVar50);
          auVar118 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
          auVar119 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
          auVar120._8_4_ = 0x3f000000;
          auVar120._0_8_ = 0x3f0000003f000000;
          auVar120._12_4_ = 0x3f000000;
          auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar125 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
          auVar126 = ZEXT1664(CONCAT412(0xb95e8083,CONCAT48(0xb95e8083,0xb95e8083b95e8083)));
          auVar127 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
          auVar51 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar134 = ZEXT1664(auVar51);
          auVar130 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
          auVar131 = ZEXT1664(CONCAT412(0x3d2aa9c1,CONCAT48(0x3d2aa9c1,0x3d2aa9c13d2aa9c1)));
          auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar132 = ZEXT1664(auVar51);
          auVar51 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          uVar32 = 0;
          auVar52 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar54 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          for (; uVar32 != uVar44; uVar32 = uVar32 + 1) {
            pauVar34 = (undefined1 (*) [16])
                       (top_blob->elemsize * uVar32 * top_blob->cstep + (long)top_blob->data);
            pvVar6 = (this->weight_data_tm).data;
            pauVar35 = pauVar34;
            for (iVar39 = 0; iVar39 <= iVar43; iVar39 = iVar39 + 1) {
              for (iVar30 = 0; iVar30 <= iVar24; iVar30 = iVar30 + 1) {
                auVar129 = ZEXT1664((undefined1  [16])0x0);
                uVar42 = 0;
                auVar55 = vpxord_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
                for (; uVar47 != uVar42; uVar42 = uVar42 + 1) {
                  auVar85._8_8_ = 0;
                  auVar85._0_8_ =
                       *(ulong *)((long)local_2e8.data +
                                 (long)*(int *)(opt_q._0_8_ + uVar42 * 4) * 8 +
                                 (long)iVar39 * (long)(this->super_ConvolutionDepthWise).stride_h *
                                 (long)local_2e8.w * local_2e8.elemsize +
                                 (long)((this->super_ConvolutionDepthWise).stride_w * iVar30 * 8) +
                                 local_2e8.cstep * uVar32 * local_2e8.elemsize);
                  auVar60 = vpcmpgtb_avx((undefined1  [16])0x0,auVar85);
                  auVar56 = vpunpcklbw_avx(auVar85,auVar60);
                  auVar93._8_8_ = 0;
                  auVar93._0_8_ = *(ulong *)((long)pvVar6 + uVar42 * 8 + (long)iVar28);
                  auVar60 = vpcmpgtb_avx((undefined1  [16])0x0,auVar93);
                  auVar60 = vpunpcklbw_avx(auVar93,auVar60);
                  auVar61 = vpmullw_avx(auVar60,auVar56);
                  auVar60 = vpmulhw_avx(auVar56,auVar60);
                  auVar56 = vpunpcklwd_avx(auVar61,auVar60);
                  auVar60 = vpunpckhwd_avx(auVar61,auVar60);
                  auVar55 = vpaddd_avx512vl(auVar55,auVar56);
                  auVar60 = vpaddd_avx(auVar129._0_16_,auVar60);
                  auVar129 = ZEXT1664(auVar60);
                }
                pvVar7 = (this->super_ConvolutionDepthWise).weight_data_int8_scales.data;
                pvVar41 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
                auVar60 = *(undefined1 (*) [16])((long)pvVar7 + uVar32 * 0x20);
                auVar61 = *(undefined1 (*) [16])((long)pvVar7 + uVar32 * 0x20 + 0x10);
                auVar56 = vmulps_avx512vl(auVar60,*(undefined1 (*) [16])
                                                   ((long)pvVar41 + uVar32 * 0x20));
                auVar57 = vmulps_avx512vl(auVar61,*(undefined1 (*) [16])
                                                   ((long)pvVar41 + uVar32 * 0x20 + 0x10));
                auVar56 = vrcpps_avx(auVar56);
                auVar57 = vrcpps_avx(auVar57);
                uVar42 = vcmpps_avx512vl(auVar60,(undefined1  [16])0x0,4);
                uVar13 = vcmpps_avx512vl(auVar61,(undefined1  [16])0x0,4);
                auVar58._4_4_ = (uint)((byte)(uVar42 >> 1) & 1) * auVar56._4_4_;
                auVar58._0_4_ = (uint)((byte)uVar42 & 1) * auVar56._0_4_;
                auVar58._8_4_ = (uint)((byte)(uVar42 >> 2) & 1) * auVar56._8_4_;
                auVar58._12_4_ = (uint)((byte)(uVar42 >> 3) & 1) * auVar56._12_4_;
                auVar59._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar57._4_4_;
                auVar59._0_4_ = (uint)((byte)uVar13 & 1) * auVar57._0_4_;
                auVar59._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar57._8_4_;
                auVar59._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar57._12_4_;
                auVar55 = vcvtdq2ps_avx512vl(auVar55);
                auVar60 = vmulps_avx512vl(auVar58,auVar55);
                auVar55 = vcvtdq2ps_avx(auVar129._0_16_);
                auVar55 = vmulps_avx512vl(auVar59,auVar55);
                if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                  pvVar7 = (this->super_ConvolutionDepthWise).bias_data.data;
                  auVar60 = vaddps_avx512vl(auVar60,*(undefined1 (*) [16])
                                                     ((long)pvVar7 + uVar32 * 0x20));
                  auVar55 = vaddps_avx512vl(auVar55,*(undefined1 (*) [16])
                                                     ((long)pvVar7 + uVar32 * 0x20 + 0x10));
                }
                in_ZMM21 = ZEXT1664(auVar55);
                iVar21 = (this->super_ConvolutionDepthWise).activation_type;
                auVar56 = auVar55;
                auVar61 = auVar60;
                if (iVar21 - 1U < 6) {
                  auVar61 = vmaxps_avx512vl(auVar60,(undefined1  [16])0x0);
                  auVar56 = vmaxps_avx512vl(auVar55,(undefined1  [16])0x0);
                  auVar76 = auVar133._0_16_;
                  auVar116 = auVar118._0_16_;
                  auVar93 = auVar126._0_16_;
                  auVar100 = auVar134._0_16_;
                  auVar106 = auVar132._0_16_;
                  auVar90 = auVar131._0_16_;
                  auVar59 = auVar130._0_16_;
                  auVar117 = auVar119._0_16_;
                  auVar58 = auVar127._0_16_;
                  auVar85 = auVar125._0_16_;
                  auVar57 = auVar79._0_16_;
                  switch(iVar21) {
                  case 2:
                    uVar82 = *(this->super_ConvolutionDepthWise).activation_params.data;
                    auVar86._4_4_ = uVar82;
                    auVar86._0_4_ = uVar82;
                    auVar86._8_4_ = uVar82;
                    auVar86._12_4_ = uVar82;
                    auVar60 = vminps_avx512vl(auVar60,(undefined1  [16])0x0);
                    auVar61 = vfmadd231ps_fma(auVar61,auVar86,auVar60);
                    auVar55 = vminps_avx512vl(auVar55,(undefined1  [16])0x0);
                    auVar56 = vfmadd231ps_avx512vl(auVar56,auVar86,auVar55);
                    break;
                  case 3:
                    puVar25 = (undefined4 *)
                              (this->super_ConvolutionDepthWise).activation_params.data;
                    uVar82 = *puVar25;
                    auVar89._4_4_ = uVar82;
                    auVar89._0_4_ = uVar82;
                    auVar89._8_4_ = uVar82;
                    auVar89._12_4_ = uVar82;
                    uVar82 = puVar25[1];
                    auVar101._4_4_ = uVar82;
                    auVar101._0_4_ = uVar82;
                    auVar101._8_4_ = uVar82;
                    auVar101._12_4_ = uVar82;
                    auVar60 = vmaxps_avx512vl(auVar60,auVar89);
                    auVar61 = vminps_avx(auVar60,auVar101);
                    auVar55 = vmaxps_avx512vl(auVar55,auVar89);
                    auVar56 = vminps_avx512vl(auVar55,auVar101);
                    break;
                  case 4:
                    auVar60 = vxorps_avx512vl(auVar60,auVar57);
                    auVar60 = vminps_avx512vl(auVar60,auVar76);
                    auVar61 = vmaxps_avx(auVar60,auVar116);
                    auVar56 = vfmadd213ps_fma(auVar117,auVar61,auVar120);
                    auVar114._0_4_ = (int)auVar56._0_4_;
                    auVar114._4_4_ = (int)auVar56._4_4_;
                    auVar114._8_4_ = (int)auVar56._8_4_;
                    auVar114._12_4_ = (int)auVar56._12_4_;
                    auVar60 = vcvtdq2ps_avx(auVar114);
                    uVar42 = vcmpps_avx512vl(auVar56,auVar60,1);
                    auVar56 = vsubps_avx512vl(auVar60,auVar50);
                    bVar48 = (bool)((byte)uVar42 & 1);
                    auVar77._0_4_ =
                         (float)((uint)bVar48 * auVar56._0_4_ | (uint)!bVar48 * auVar60._0_4_);
                    bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                    auVar77._4_4_ =
                         (float)((uint)bVar48 * auVar56._4_4_ | (uint)!bVar48 * auVar60._4_4_);
                    bVar48 = (bool)((byte)(uVar42 >> 2) & 1);
                    auVar77._8_4_ =
                         (float)((uint)bVar48 * auVar56._8_4_ | (uint)!bVar48 * auVar60._8_4_);
                    bVar48 = (bool)((byte)(uVar42 >> 3) & 1);
                    auVar77._12_4_ =
                         (float)((uint)bVar48 * auVar56._12_4_ | (uint)!bVar48 * auVar60._12_4_);
                    auVar60 = vfmsub231ps_fma(auVar61,auVar77,auVar85);
                    auVar61 = vfnmsub231ps_fma(auVar60,auVar77,auVar93);
                    auVar102._0_4_ = auVar61._0_4_ * auVar61._0_4_;
                    auVar102._4_4_ = auVar61._4_4_ * auVar61._4_4_;
                    auVar102._8_4_ = auVar61._8_4_ * auVar61._8_4_;
                    auVar102._12_4_ = auVar61._12_4_ * auVar61._12_4_;
                    auVar60 = vfmadd213ps_fma(auVar100,auVar61,auVar58);
                    auVar60 = vfmadd213ps_fma(auVar60,auVar61,auVar59);
                    auVar60 = vfmadd213ps_fma(auVar60,auVar61,auVar90);
                    auVar60 = vfmadd213ps_avx512vl(auVar60,auVar61,auVar106);
                    auVar60 = vfmadd213ps_fma(auVar60,auVar61,auVar120);
                    auVar60 = vfmadd213ps_fma(auVar60,auVar102,auVar61);
                    auVar60 = vaddps_avx512vl(auVar60,auVar50);
                    auVar103._0_4_ = (int)auVar77._0_4_;
                    auVar103._4_4_ = (int)auVar77._4_4_;
                    auVar103._8_4_ = (int)auVar77._8_4_;
                    auVar103._12_4_ = (int)auVar77._12_4_;
                    auVar61 = vpslld_avx(auVar103,0x17);
                    auVar61 = vpaddd_avx512vl(auVar61,auVar51);
                    auVar60 = vfmadd213ps_avx512vl(auVar61,auVar60,auVar50);
                    auVar61 = vdivps_avx512vl(auVar50,auVar60);
                    auVar55 = vxorps_avx512vl(auVar55,auVar57);
                    auVar55 = vminps_avx512vl(auVar55,auVar76);
                    auVar60 = vmaxps_avx(auVar55,auVar116);
                    auVar56 = vfmadd213ps_fma(auVar117,auVar60,auVar120);
                    auVar115._0_4_ = (int)auVar56._0_4_;
                    auVar115._4_4_ = (int)auVar56._4_4_;
                    auVar115._8_4_ = (int)auVar56._8_4_;
                    auVar115._12_4_ = (int)auVar56._12_4_;
                    auVar55 = vcvtdq2ps_avx(auVar115);
                    uVar42 = vcmpps_avx512vl(auVar56,auVar55,1);
                    auVar56 = vsubps_avx512vl(auVar55,auVar50);
                    bVar48 = (bool)((byte)uVar42 & 1);
                    auVar78._0_4_ =
                         (float)((uint)bVar48 * auVar56._0_4_ | (uint)!bVar48 * auVar55._0_4_);
                    bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                    auVar78._4_4_ =
                         (float)((uint)bVar48 * auVar56._4_4_ | (uint)!bVar48 * auVar55._4_4_);
                    bVar48 = (bool)((byte)(uVar42 >> 2) & 1);
                    auVar78._8_4_ =
                         (float)((uint)bVar48 * auVar56._8_4_ | (uint)!bVar48 * auVar55._8_4_);
                    bVar48 = (bool)((byte)(uVar42 >> 3) & 1);
                    auVar78._12_4_ =
                         (float)((uint)bVar48 * auVar56._12_4_ | (uint)!bVar48 * auVar55._12_4_);
                    auVar55 = vfmsub231ps_fma(auVar60,auVar78,auVar85);
                    auVar55 = vfnmsub231ps_fma(auVar55,auVar78,auVar93);
                    auVar104._0_4_ = auVar55._0_4_ * auVar55._0_4_;
                    auVar104._4_4_ = auVar55._4_4_ * auVar55._4_4_;
                    auVar104._8_4_ = auVar55._8_4_ * auVar55._8_4_;
                    auVar104._12_4_ = auVar55._12_4_ * auVar55._12_4_;
                    auVar60 = vfmadd213ps_avx512vl(auVar100,auVar55,auVar58);
                    auVar60 = vfmadd213ps_avx512vl(auVar60,auVar55,auVar59);
                    auVar60 = vfmadd213ps_avx512vl(auVar60,auVar55,auVar90);
                    auVar60 = vfmadd213ps_avx512vl(auVar60,auVar55,auVar106);
                    auVar60 = vfmadd213ps_avx512vl(auVar60,auVar55,auVar120);
                    auVar55 = vfmadd213ps_avx512vl(auVar60,auVar104,auVar55);
                    in_ZMM21 = ZEXT1664(auVar55);
                    auVar55 = vaddps_avx512vl(auVar55,auVar50);
                    auVar105._0_4_ = (int)auVar78._0_4_;
                    auVar105._4_4_ = (int)auVar78._4_4_;
                    auVar105._8_4_ = (int)auVar78._8_4_;
                    auVar105._12_4_ = (int)auVar78._12_4_;
                    auVar60 = vpslld_avx(auVar105,0x17);
                    auVar60 = vpaddd_avx512vl(auVar60,auVar51);
                    auVar55 = vfmadd213ps_avx512vl(auVar60,auVar55,auVar50);
                    auVar56 = vdivps_avx512vl(auVar50,auVar55);
                    break;
                  case 5:
                    auVar61 = vminps_avx512vl(auVar60,auVar76);
                    auVar56 = vmaxps_avx(auVar61,auVar116);
                    auVar62 = vfmadd213ps_fma(auVar117,auVar56,auVar120);
                    auVar110._0_4_ = (int)auVar62._0_4_;
                    auVar110._4_4_ = (int)auVar62._4_4_;
                    auVar110._8_4_ = (int)auVar62._8_4_;
                    auVar110._12_4_ = (int)auVar62._12_4_;
                    auVar61 = vcvtdq2ps_avx(auVar110);
                    uVar42 = vcmpps_avx512vl(auVar62,auVar61,1);
                    auVar62 = vsubps_avx512vl(auVar61,auVar50);
                    bVar48 = (bool)((byte)uVar42 & 1);
                    auVar63._0_4_ =
                         (float)((uint)bVar48 * auVar62._0_4_ | (uint)!bVar48 * auVar61._0_4_);
                    bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                    auVar63._4_4_ =
                         (float)((uint)bVar48 * auVar62._4_4_ | (uint)!bVar48 * auVar61._4_4_);
                    bVar48 = (bool)((byte)(uVar42 >> 2) & 1);
                    auVar63._8_4_ =
                         (float)((uint)bVar48 * auVar62._8_4_ | (uint)!bVar48 * auVar61._8_4_);
                    bVar48 = (bool)((byte)(uVar42 >> 3) & 1);
                    auVar63._12_4_ =
                         (float)((uint)bVar48 * auVar62._12_4_ | (uint)!bVar48 * auVar61._12_4_);
                    auVar61 = vfmsub231ps_fma(auVar56,auVar63,auVar85);
                    auVar56 = vfnmsub231ps_fma(auVar61,auVar63,auVar93);
                    auVar94._0_4_ = auVar56._0_4_ * auVar56._0_4_;
                    auVar94._4_4_ = auVar56._4_4_ * auVar56._4_4_;
                    auVar94._8_4_ = auVar56._8_4_ * auVar56._8_4_;
                    auVar94._12_4_ = auVar56._12_4_ * auVar56._12_4_;
                    auVar61 = vfmadd213ps_fma(auVar100,auVar56,auVar58);
                    auVar61 = vfmadd213ps_fma(auVar61,auVar56,auVar59);
                    auVar61 = vfmadd213ps_fma(auVar61,auVar56,auVar90);
                    auVar61 = vfmadd213ps_avx512vl(auVar61,auVar56,auVar106);
                    auVar61 = vfmadd213ps_fma(auVar61,auVar56,auVar120);
                    auVar61 = vfmadd213ps_fma(auVar61,auVar94,auVar56);
                    auVar61 = vaddps_avx512vl(auVar61,auVar50);
                    auVar95._0_4_ = (int)auVar63._0_4_;
                    auVar95._4_4_ = (int)auVar63._4_4_;
                    auVar95._8_4_ = (int)auVar63._8_4_;
                    auVar95._12_4_ = (int)auVar63._12_4_;
                    auVar56 = vpslld_avx(auVar95,0x17);
                    auVar56 = vpaddd_avx512vl(auVar56,auVar51);
                    auVar61 = vfmadd213ps_avx512vl(auVar56,auVar61,auVar50);
                    uVar42 = vcmpps_avx512vl(auVar61,(undefined1  [16])0x0,2);
                    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x800000));
                    auVar61 = vmaxps_avx512vl(auVar61,auVar56);
                    auVar62 = vpsrld_avx(auVar61,0x17);
                    auVar56 = vpternlogd_avx512vl(auVar61,auVar83,auVar52,0xec);
                    auVar61 = vpbroadcastd_avx512vl(ZEXT416(0xffffff82));
                    auVar61 = vpaddd_avx512vl(auVar62,auVar61);
                    auVar61 = vcvtdq2ps_avx(auVar61);
                    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
                    uVar13 = vcmpps_avx512vl(auVar56,auVar64,1);
                    auVar62 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
                    auVar62 = vaddps_avx512vl(auVar56,auVar62);
                    auVar65 = vsubps_avx512vl(auVar61,auVar50);
                    bVar48 = (bool)((byte)uVar13 & 1);
                    auVar66._0_4_ = (uint)bVar48 * auVar65._0_4_ | (uint)!bVar48 * auVar61._0_4_;
                    bVar48 = (bool)((byte)(uVar13 >> 1) & 1);
                    auVar66._4_4_ = (uint)bVar48 * auVar65._4_4_ | (uint)!bVar48 * auVar61._4_4_;
                    bVar48 = (bool)((byte)(uVar13 >> 2) & 1);
                    auVar66._8_4_ = (uint)bVar48 * auVar65._8_4_ | (uint)!bVar48 * auVar61._8_4_;
                    bVar48 = (bool)((byte)(uVar13 >> 3) & 1);
                    auVar66._12_4_ = (uint)bVar48 * auVar65._12_4_ | (uint)!bVar48 * auVar61._12_4_;
                    auVar61 = vaddps_avx512vl(auVar62,auVar56);
                    bVar48 = (bool)((byte)uVar13 & 1);
                    auVar67._0_4_ =
                         (float)((uint)bVar48 * auVar61._0_4_ | (uint)!bVar48 * auVar62._0_4_);
                    bVar48 = (bool)((byte)(uVar13 >> 1) & 1);
                    auVar67._4_4_ =
                         (float)((uint)bVar48 * auVar61._4_4_ | (uint)!bVar48 * auVar62._4_4_);
                    bVar48 = (bool)((byte)(uVar13 >> 2) & 1);
                    auVar67._8_4_ =
                         (float)((uint)bVar48 * auVar61._8_4_ | (uint)!bVar48 * auVar62._8_4_);
                    bVar48 = (bool)((byte)(uVar13 >> 3) & 1);
                    auVar67._12_4_ =
                         (float)((uint)bVar48 * auVar61._12_4_ | (uint)!bVar48 * auVar62._12_4_);
                    auVar87._0_4_ = auVar67._0_4_ * auVar67._0_4_;
                    auVar87._4_4_ = auVar67._4_4_ * auVar67._4_4_;
                    auVar87._8_4_ = auVar67._8_4_ * auVar67._8_4_;
                    auVar87._12_4_ = auVar67._12_4_ * auVar67._12_4_;
                    auVar128._8_4_ = 0x3d9021bb;
                    auVar128._0_8_ = 0x3d9021bb3d9021bb;
                    auVar128._12_4_ = 0x3d9021bb;
                    auVar68 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
                    auVar61 = vfmadd213ps_avx512vl(auVar128,auVar67,auVar68);
                    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
                    auVar61 = vfmadd213ps_avx512vl(auVar61,auVar67,auVar69);
                    auVar61 = vfmadd213ps_avx512vl(auVar61,auVar67,auVar53);
                    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
                    auVar61 = vfmadd213ps_avx512vl(auVar61,auVar67,auVar70);
                    auVar61 = vfmadd213ps_avx512vl(auVar61,auVar67,auVar54);
                    auVar121._8_4_ = 0x3e4cceac;
                    auVar121._0_8_ = 0x3e4cceac3e4cceac;
                    auVar121._12_4_ = 0x3e4cceac;
                    auVar61 = vfmadd213ps_fma(auVar61,auVar67,auVar121);
                    auVar122._8_4_ = 0xbe7ffffc;
                    auVar122._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar122._12_4_ = 0xbe7ffffc;
                    auVar61 = vfmadd213ps_fma(auVar61,auVar67,auVar122);
                    auVar123._8_4_ = 0x3eaaaaaa;
                    auVar123._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar123._12_4_ = 0x3eaaaaaa;
                    auVar61 = vfmadd213ps_fma(auVar61,auVar67,auVar123);
                    auVar56 = vmulps_avx512vl(auVar87,auVar67);
                    auVar61 = vmulps_avx512vl(auVar56,auVar61);
                    auVar61 = vfmadd231ps_fma(auVar61,auVar66,auVar93);
                    auVar61 = vfmsub231ps_fma(auVar61,auVar120,auVar87);
                    auVar61 = vsubps_avx(auVar61,auVar67);
                    auVar61 = vfmsub231ps_fma(auVar61,auVar85,auVar66);
                    bVar48 = (bool)((byte)uVar42 & 1);
                    auVar62._0_4_ =
                         (uint)bVar48 * 0x7fffffff | (uint)!bVar48 * (int)(auVar61._0_4_ * -2.0);
                    bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                    auVar62._4_4_ =
                         (uint)bVar48 * 0x7fffffff | (uint)!bVar48 * (int)(auVar61._4_4_ * -2.0);
                    bVar48 = (bool)((byte)(uVar42 >> 2) & 1);
                    auVar62._8_4_ =
                         (uint)bVar48 * 0x7fffffff | (uint)!bVar48 * (int)(auVar61._8_4_ * -2.0);
                    bVar48 = (bool)((byte)(uVar42 >> 3) & 1);
                    auVar62._12_4_ =
                         (uint)bVar48 * 0x7fffffff | (uint)!bVar48 * (int)(auVar61._12_4_ * -2.0);
                    auVar61 = vminps_avx(auVar62,auVar76);
                    auVar61 = vmaxps_avx(auVar116,auVar61);
                    auVar56 = vfmadd213ps_fma(auVar117,auVar61,auVar120);
                    auVar111._0_4_ = (int)auVar56._0_4_;
                    auVar111._4_4_ = (int)auVar56._4_4_;
                    auVar111._8_4_ = (int)auVar56._8_4_;
                    auVar111._12_4_ = (int)auVar56._12_4_;
                    auVar62 = vcvtdq2ps_avx512vl(auVar111);
                    uVar42 = vcmpps_avx512vl(auVar56,auVar62,1);
                    auVar56 = vsubps_avx512vl(auVar62,auVar50);
                    bVar48 = (bool)((byte)uVar42 & 1);
                    auVar71._0_4_ = (uint)bVar48 * auVar56._0_4_ | (uint)!bVar48 * auVar62._0_4_;
                    bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                    auVar71._4_4_ = (uint)bVar48 * auVar56._4_4_ | (uint)!bVar48 * auVar62._4_4_;
                    bVar48 = (bool)((byte)(uVar42 >> 2) & 1);
                    auVar71._8_4_ = (uint)bVar48 * auVar56._8_4_ | (uint)!bVar48 * auVar62._8_4_;
                    bVar48 = (bool)((byte)(uVar42 >> 3) & 1);
                    auVar71._12_4_ = (uint)bVar48 * auVar56._12_4_ | (uint)!bVar48 * auVar62._12_4_;
                    auVar61 = vfmsub231ps_avx512vl(auVar61,auVar71,auVar85);
                    auVar56 = vfnmsub231ps_avx512vl(auVar61,auVar71,auVar93);
                    auVar96._0_4_ = auVar56._0_4_ * auVar56._0_4_;
                    auVar96._4_4_ = auVar56._4_4_ * auVar56._4_4_;
                    auVar96._8_4_ = auVar56._8_4_ * auVar56._8_4_;
                    auVar96._12_4_ = auVar56._12_4_ * auVar56._12_4_;
                    auVar61 = vfmadd213ps_fma(auVar100,auVar56,auVar58);
                    auVar61 = vfmadd213ps_fma(auVar61,auVar56,auVar59);
                    auVar61 = vfmadd213ps_avx512vl(auVar61,auVar56,auVar90);
                    auVar61 = vfmadd213ps_avx512vl(auVar61,auVar56,auVar106);
                    auVar61 = vfmadd213ps_fma(auVar61,auVar56,auVar120);
                    auVar62 = vfmadd213ps_fma(auVar61,auVar96,auVar56);
                    auVar61 = vminps_avx512vl(auVar55,auVar76);
                    auVar56 = vmaxps_avx(auVar116,auVar61);
                    auVar65 = vfmadd213ps_fma(auVar117,auVar56,auVar120);
                    auVar112._0_4_ = (int)auVar65._0_4_;
                    auVar112._4_4_ = (int)auVar65._4_4_;
                    auVar112._8_4_ = (int)auVar65._8_4_;
                    auVar112._12_4_ = (int)auVar65._12_4_;
                    auVar61 = vcvtdq2ps_avx(auVar112);
                    uVar42 = vcmpps_avx512vl(auVar65,auVar61,1);
                    auVar65 = vsubps_avx512vl(auVar61,auVar50);
                    bVar48 = (bool)((byte)uVar42 & 1);
                    auVar72._0_4_ =
                         (float)((uint)bVar48 * auVar65._0_4_ | (uint)!bVar48 * auVar61._0_4_);
                    bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                    auVar72._4_4_ =
                         (float)((uint)bVar48 * auVar65._4_4_ | (uint)!bVar48 * auVar61._4_4_);
                    bVar48 = (bool)((byte)(uVar42 >> 2) & 1);
                    auVar72._8_4_ =
                         (float)((uint)bVar48 * auVar65._8_4_ | (uint)!bVar48 * auVar61._8_4_);
                    bVar48 = (bool)((byte)(uVar42 >> 3) & 1);
                    auVar72._12_4_ =
                         (float)((uint)bVar48 * auVar65._12_4_ | (uint)!bVar48 * auVar61._12_4_);
                    auVar61 = vfmsub231ps_fma(auVar56,auVar72,auVar85);
                    auVar61 = vfnmsub231ps_fma(auVar61,auVar72,auVar93);
                    auVar97._0_4_ = auVar61._0_4_ * auVar61._0_4_;
                    auVar97._4_4_ = auVar61._4_4_ * auVar61._4_4_;
                    auVar97._8_4_ = auVar61._8_4_ * auVar61._8_4_;
                    auVar97._12_4_ = auVar61._12_4_ * auVar61._12_4_;
                    auVar56 = vfmadd213ps_avx512vl(auVar100,auVar61,auVar58);
                    auVar56 = vfmadd213ps_avx512vl(auVar56,auVar61,auVar59);
                    auVar56 = vfmadd213ps_avx512vl(auVar56,auVar61,auVar90);
                    auVar56 = vfmadd213ps_avx512vl(auVar56,auVar61,auVar106);
                    auVar56 = vfmadd213ps_avx512vl(auVar56,auVar61,auVar120);
                    auVar61 = vfmadd213ps_avx512vl(auVar56,auVar97,auVar61);
                    auVar61 = vaddps_avx512vl(auVar61,auVar50);
                    auVar98._0_4_ = (int)auVar72._0_4_;
                    auVar98._4_4_ = (int)auVar72._4_4_;
                    auVar98._8_4_ = (int)auVar72._8_4_;
                    auVar98._12_4_ = (int)auVar72._12_4_;
                    auVar56 = vpslld_avx(auVar98,0x17);
                    auVar56 = vpaddd_avx512vl(auVar56,auVar51);
                    auVar61 = vfmadd213ps_avx512vl(auVar56,auVar61,auVar50);
                    uVar42 = vcmpps_avx512vl(auVar61,(undefined1  [16])0x0,2);
                    auVar65._8_4_ = 0x800000;
                    auVar65._0_8_ = 0x80000000800000;
                    auVar65._12_4_ = 0x800000;
                    auVar61 = vmaxps_avx512vl(auVar61,auVar65);
                    auVar65 = vpsrld_avx(auVar61,0x17);
                    auVar61 = vpternlogd_avx512vl(auVar61,auVar83,auVar52,0xec);
                    uVar13 = vcmpps_avx512vl(auVar61,auVar64,1);
                    auVar64._8_4_ = 0xbf800000;
                    auVar64._0_8_ = 0xbf800000bf800000;
                    auVar64._12_4_ = 0xbf800000;
                    auVar56 = vaddps_avx512vl(auVar61,auVar64);
                    auVar61 = vaddps_avx512vl(auVar56,auVar61);
                    bVar48 = (bool)((byte)uVar13 & 1);
                    auVar73._0_4_ =
                         (float)((uint)bVar48 * auVar61._0_4_ | (uint)!bVar48 * auVar56._0_4_);
                    bVar48 = (bool)((byte)(uVar13 >> 1) & 1);
                    auVar73._4_4_ =
                         (float)((uint)bVar48 * auVar61._4_4_ | (uint)!bVar48 * auVar56._4_4_);
                    bVar48 = (bool)((byte)(uVar13 >> 2) & 1);
                    auVar73._8_4_ =
                         (float)((uint)bVar48 * auVar61._8_4_ | (uint)!bVar48 * auVar56._8_4_);
                    bVar48 = (bool)((byte)(uVar13 >> 3) & 1);
                    auVar73._12_4_ =
                         (float)((uint)bVar48 * auVar61._12_4_ | (uint)!bVar48 * auVar56._12_4_);
                    auVar88._0_4_ = auVar73._0_4_ * auVar73._0_4_;
                    auVar88._4_4_ = auVar73._4_4_ * auVar73._4_4_;
                    auVar88._8_4_ = auVar73._8_4_ * auVar73._8_4_;
                    auVar88._12_4_ = auVar73._12_4_ * auVar73._12_4_;
                    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                    auVar61 = vfmadd213ps_avx512vl(auVar61,auVar73,auVar68);
                    auVar133 = ZEXT1664(auVar76);
                    auVar118 = ZEXT1664(auVar116);
                    auVar127 = ZEXT1664(auVar58);
                    auVar119 = ZEXT1664(auVar117);
                    auVar130 = ZEXT1664(auVar59);
                    auVar131 = ZEXT1664(auVar90);
                    auVar132 = ZEXT1664(auVar106);
                    auVar61 = vfmadd213ps_avx512vl(auVar61,auVar73,auVar69);
                    auVar61 = vfmadd213ps_avx512vl(auVar61,auVar73,auVar53);
                    auVar61 = vfmadd213ps_avx512vl(auVar61,auVar73,auVar70);
                    auVar61 = vfmadd213ps_avx512vl(auVar61,auVar73,auVar54);
                    auVar68._8_4_ = 0x3e4cceac;
                    auVar68._0_8_ = 0x3e4cceac3e4cceac;
                    auVar68._12_4_ = 0x3e4cceac;
                    auVar61 = vfmadd213ps_avx512vl(auVar61,auVar73,auVar68);
                    auVar69._8_4_ = 0xbe7ffffc;
                    auVar69._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar69._12_4_ = 0xbe7ffffc;
                    auVar61 = vfmadd213ps_avx512vl(auVar61,auVar73,auVar69);
                    auVar70._8_4_ = 0x3eaaaaaa;
                    auVar70._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar70._12_4_ = 0x3eaaaaaa;
                    auVar61 = vfmadd213ps_avx512vl(auVar61,auVar73,auVar70);
                    auVar56 = vmulps_avx512vl(auVar88,auVar73);
                    auVar56 = vmulps_avx512vl(auVar56,auVar61);
                    auVar134 = ZEXT1664(auVar100);
                    auVar125 = ZEXT1664(auVar85);
                    auVar126 = ZEXT1664(auVar93);
                    auVar79 = ZEXT1664(auVar57);
                    auVar15._8_4_ = 0xffffff82;
                    auVar15._0_8_ = 0xffffff82ffffff82;
                    auVar15._12_4_ = 0xffffff82;
                    auVar61 = vpaddd_avx512vl(auVar65,auVar15);
                    auVar61 = vcvtdq2ps_avx(auVar61);
                    auVar57 = vsubps_avx512vl(auVar61,auVar50);
                    bVar48 = (bool)((byte)uVar13 & 1);
                    auVar74._0_4_ = (uint)bVar48 * auVar57._0_4_ | (uint)!bVar48 * auVar61._0_4_;
                    bVar48 = (bool)((byte)(uVar13 >> 1) & 1);
                    auVar74._4_4_ = (uint)bVar48 * auVar57._4_4_ | (uint)!bVar48 * auVar61._4_4_;
                    bVar48 = (bool)((byte)(uVar13 >> 2) & 1);
                    auVar74._8_4_ = (uint)bVar48 * auVar57._8_4_ | (uint)!bVar48 * auVar61._8_4_;
                    bVar48 = (bool)((byte)(uVar13 >> 3) & 1);
                    auVar74._12_4_ = (uint)bVar48 * auVar57._12_4_ | (uint)!bVar48 * auVar61._12_4_;
                    auVar61 = vfmadd231ps_avx512vl(auVar56,auVar74,auVar93);
                    auVar61 = vfmsub231ps_avx512vl(auVar61,auVar120,auVar88);
                    auVar61 = vsubps_avx512vl(auVar61,auVar73);
                    auVar61 = vfmsub231ps_fma(auVar61,auVar85,auVar74);
                    auVar16._8_4_ = 0xc0000000;
                    auVar16._0_8_ = 0xc0000000c0000000;
                    auVar16._12_4_ = 0xc0000000;
                    auVar61 = vmulps_avx512vl(auVar61,auVar16);
                    bVar48 = (bool)((byte)uVar42 & 1);
                    auVar75._0_4_ = (uint)bVar48 * 0x7fffffff | (uint)!bVar48 * auVar61._0_4_;
                    bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                    auVar75._4_4_ = (uint)bVar48 * 0x7fffffff | (uint)!bVar48 * auVar61._4_4_;
                    bVar48 = (bool)((byte)(uVar42 >> 2) & 1);
                    auVar75._8_4_ = (uint)bVar48 * 0x7fffffff | (uint)!bVar48 * auVar61._8_4_;
                    bVar48 = (bool)((byte)(uVar42 >> 3) & 1);
                    auVar75._12_4_ = (uint)bVar48 * 0x7fffffff | (uint)!bVar48 * auVar61._12_4_;
                    auVar61 = vminps_avx512vl(auVar75,auVar76);
                    auVar56 = vmaxps_avx(auVar61,auVar116);
                    auVar57 = vfmadd213ps_fma(auVar117,auVar56,auVar120);
                    auVar113._0_4_ = (int)auVar57._0_4_;
                    auVar113._4_4_ = (int)auVar57._4_4_;
                    auVar113._8_4_ = (int)auVar57._8_4_;
                    auVar113._12_4_ = (int)auVar57._12_4_;
                    auVar61 = vcvtdq2ps_avx(auVar113);
                    uVar42 = vcmpps_avx512vl(auVar57,auVar61,1);
                    auVar57 = vsubps_avx512vl(auVar61,auVar50);
                    bVar48 = (bool)((byte)uVar42 & 1);
                    auVar76._0_4_ =
                         (float)((uint)bVar48 * auVar57._0_4_ | (uint)!bVar48 * auVar61._0_4_);
                    bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                    auVar76._4_4_ =
                         (float)((uint)bVar48 * auVar57._4_4_ | (uint)!bVar48 * auVar61._4_4_);
                    bVar48 = (bool)((byte)(uVar42 >> 2) & 1);
                    auVar76._8_4_ =
                         (float)((uint)bVar48 * auVar57._8_4_ | (uint)!bVar48 * auVar61._8_4_);
                    bVar48 = (bool)((byte)(uVar42 >> 3) & 1);
                    auVar76._12_4_ =
                         (float)((uint)bVar48 * auVar57._12_4_ | (uint)!bVar48 * auVar61._12_4_);
                    auVar61 = vfmsub231ps_fma(auVar56,auVar76,auVar85);
                    auVar61 = vfnmsub231ps_fma(auVar61,auVar76,auVar93);
                    auVar99._0_4_ = auVar61._0_4_ * auVar61._0_4_;
                    auVar99._4_4_ = auVar61._4_4_ * auVar61._4_4_;
                    auVar99._8_4_ = auVar61._8_4_ * auVar61._8_4_;
                    auVar99._12_4_ = auVar61._12_4_ * auVar61._12_4_;
                    auVar56 = vfmadd213ps_avx512vl(auVar100,auVar61,auVar58);
                    auVar56 = vfmadd213ps_avx512vl(auVar56,auVar61,auVar59);
                    auVar56 = vfmadd213ps_avx512vl(auVar56,auVar61,auVar90);
                    auVar56 = vfmadd213ps_avx512vl(auVar56,auVar61,auVar106);
                    auVar56 = vfmadd213ps_avx512vl(auVar56,auVar61,auVar120);
                    auVar56 = vfmadd213ps_avx512vl(auVar56,auVar99,auVar61);
                    auVar61 = vaddps_avx512vl(auVar62,auVar50);
                    auVar57 = vcvttps2dq_avx512vl(auVar71);
                    auVar57 = vpslld_avx(auVar57,0x17);
                    auVar57 = vpaddd_avx512vl(auVar57,auVar51);
                    auVar61 = vfmadd213ps_avx512vl(auVar57,auVar61,auVar50);
                    auVar124._8_4_ = 0x40000000;
                    auVar124._0_8_ = 0x4000000040000000;
                    auVar124._12_4_ = 0x40000000;
                    auVar61 = vdivps_avx(auVar124,auVar61);
                    auVar61 = vfmsub213ps_avx512vl(auVar61,auVar60,auVar60);
                    auVar60 = vaddps_avx512vl(auVar56,auVar50);
                    auVar100._0_4_ = (int)auVar76._0_4_;
                    auVar100._4_4_ = (int)auVar76._4_4_;
                    auVar100._8_4_ = (int)auVar76._8_4_;
                    auVar100._12_4_ = (int)auVar76._12_4_;
                    auVar56 = vpslld_avx(auVar100,0x17);
                    auVar56 = vpaddd_avx512vl(auVar56,auVar51);
                    auVar60 = vfmadd213ps_avx512vl(auVar56,auVar60,auVar50);
                    auVar60 = vdivps_avx512vl(auVar124,auVar60);
                    auVar56 = vfmsub213ps_avx512vl(auVar60,auVar55,auVar55);
                    break;
                  case 6:
                    puVar25 = (undefined4 *)
                              (this->super_ConvolutionDepthWise).activation_params.data;
                    uVar82 = *puVar25;
                    auVar90._4_4_ = uVar82;
                    auVar90._0_4_ = uVar82;
                    auVar90._8_4_ = uVar82;
                    auVar90._12_4_ = uVar82;
                    uVar82 = puVar25[1];
                    auVar106._4_4_ = uVar82;
                    auVar106._0_4_ = uVar82;
                    auVar106._8_4_ = uVar82;
                    auVar106._12_4_ = uVar82;
                    auVar61 = vfmadd213ps_fma(auVar60,auVar90,auVar106);
                    auVar61 = vmaxps_avx(auVar61,(undefined1  [16])0x0);
                    auVar61 = vminps_avx512vl(auVar61,auVar50);
                    auVar61 = vmulps_avx512vl(auVar61,auVar60);
                    auVar60 = vfmadd213ps_avx512vl(auVar90,auVar55,auVar106);
                    auVar60 = vmaxps_avx(auVar60,(undefined1  [16])0x0);
                    auVar60 = vminps_avx512vl(auVar60,auVar50);
                    auVar56 = vmulps_avx512vl(auVar60,auVar55);
                  }
                }
                if (iVar2 < 0x65) {
                  *pauVar35 = auVar61;
                  pauVar35[1] = auVar56;
                  pauVar35 = pauVar35 + 2;
                }
                else {
                  pvVar7 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
                  pfVar36 = (float *)((long)pvVar7 + uVar32 * 0x20);
                  auVar91._0_4_ = auVar61._0_4_ * *pfVar36;
                  auVar91._4_4_ = auVar61._4_4_ * pfVar36[1];
                  auVar91._8_4_ = auVar61._8_4_ * pfVar36[2];
                  auVar91._12_4_ = auVar61._12_4_ * pfVar36[3];
                  auVar55 = vmulps_avx512vl(auVar56,*(undefined1 (*) [16])
                                                     ((long)pvVar7 + uVar32 * 0x20 + 0x10));
                  auVar60 = vpternlogd_avx512vl(auVar83,auVar91,auVar79._0_16_,0xf8);
                  auVar61 = vpternlogd_avx512vl(auVar83,auVar55,auVar79._0_16_,0xf8);
                  auVar92._0_4_ = (int)(auVar91._0_4_ + auVar60._0_4_);
                  auVar92._4_4_ = (int)(auVar91._4_4_ + auVar60._4_4_);
                  auVar92._8_4_ = (int)(auVar91._8_4_ + auVar60._8_4_);
                  auVar92._12_4_ = (int)(auVar91._12_4_ + auVar60._12_4_);
                  auVar107._0_4_ = (int)(auVar61._0_4_ + auVar55._0_4_);
                  auVar107._4_4_ = (int)(auVar61._4_4_ + auVar55._4_4_);
                  auVar107._8_4_ = (int)(auVar61._8_4_ + auVar55._8_4_);
                  auVar107._12_4_ = (int)(auVar61._12_4_ + auVar55._12_4_);
                  auVar55 = vpackssdw_avx(auVar92,auVar107);
                  auVar55 = vpminsw_avx512vl(auVar55,auVar49);
                  auVar108._8_2_ = 0xff81;
                  auVar108._0_8_ = 0xff81ff81ff81ff81;
                  auVar108._10_2_ = 0xff81;
                  auVar108._12_2_ = 0xff81;
                  auVar108._14_2_ = 0xff81;
                  auVar55 = vpmaxsw_avx(auVar55,auVar108);
                  auVar55 = vpacksswb_avx(auVar55,auVar55);
                  *(long *)*pauVar34 = auVar55._0_8_;
                  pauVar34 = (undefined1 (*) [16])((long)*pauVar34 + 8);
                }
              }
            }
            iVar28 = iVar28 + (int)uVar45 * 8;
          }
LAB_003a66e2:
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
          iVar21 = 0;
        }
      }
    }
    else {
      uVar44 = (this->super_ConvolutionDepthWise).num_output;
      iVar24 = (this->super_ConvolutionDepthWise).int8_scale_term;
      if (opt->use_packing_layout == true) {
        if (iVar24 < 0x65) {
          uVar45 = (ulong)((uint)((uVar44 & 3) == 0) * 3 + 1);
        }
        else {
          uVar45 = 1;
          if ((uVar44 & 7) == 0) {
            uVar45 = 8;
          }
        }
      }
      else {
        uVar45 = 1;
      }
      _elempack = (uint)uVar45;
      uVar47 = (ulong)(_elempack * 4);
      if (100 < iVar24) {
        uVar47 = uVar45;
      }
      Mat::create(top_blob,iVar28,iVar39,(int)uVar44 / (int)_elempack,uVar47,_elempack,
                  opt->blob_allocator);
      OVar18 = opt_q;
      sVar11 = local_2e8.cstep;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar43 = (this->super_ConvolutionDepthWise).group;
        uVar32 = (long)(int)uVar46 / (long)iVar43;
        uVar44 = (this->super_ConvolutionDepthWise).num_output / iVar43;
        if (opt->use_packing_layout == true) {
          uVar46 = 1;
          if ((uVar32 & 7) == 0) {
            uVar46 = 8;
          }
          if (iVar24 < 0x65) {
            _elempack_00 = (uint)((uVar44 & 3) == 0) * 3 + 1;
          }
          else {
            _elempack_00 = 1;
            if ((uVar44 & 7) == 0) {
              _elempack_00 = 8;
            }
          }
        }
        else {
          uVar46 = 1;
          _elempack_00 = uVar46;
        }
        piVar5 = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
        opt_q.blob_allocator._4_4_ = local_2e8.refcount._4_4_;
        opt_q.blob_allocator._0_4_ = local_2e8.refcount._0_4_;
        opt_q._0_8_ = local_2e8.data;
        opt_q.workspace_allocator = (Allocator *)local_2e8.elemsize;
        opt_q._28_36_ = OVar18._28_36_;
        opt_q.openmp_blocktime = local_2e8.elempack;
        opt_q._32_8_ = local_2e8.allocator;
        opt_q.use_reserved_1 = (bool)(undefined1)local_2e8.w;
        opt_q.use_image_storage = (bool)local_2e8.w._1_1_;
        opt_q.use_tensor_storage = (bool)local_2e8.w._2_1_;
        opt_q.use_reserved_2 = (bool)local_2e8.w._3_1_;
        opt_q.vulkan_device_index = local_2e8.dims;
        opt_q.use_local_pool_allocator = (bool)(undefined1)local_2e8.d;
        opt_q.use_shader_local_memory = (bool)local_2e8.d._1_1_;
        opt_q.use_cooperative_matrix = (bool)local_2e8.d._2_1_;
        opt_q.use_winograd23_convolution = (bool)local_2e8.d._3_1_;
        opt_q.flush_denormals = local_2e8.h;
        opt_q._60_4_ = OVar18._60_4_;
        opt_q.use_winograd43_convolution = (bool)(undefined1)local_2e8.c;
        opt_q.use_winograd63_convolution = (bool)local_2e8.c._1_1_;
        opt_q.use_a53_a55_optimized_kernel = (bool)local_2e8.c._2_1_;
        opt_q.use_fp16_uniform = (bool)local_2e8.c._3_1_;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        local_340 = uVar32 & 0xffffffff;
        uVar42 = uVar32;
        if ((int)uVar46 < iVar30) {
          _top_rescale = *(void **)opt;
          pAStack_228 = opt->workspace_allocator;
          iStack_220 = opt->openmp_blocktime;
          unique0x10001a0a = opt->use_winograd_convolution;
          unique0x10001a0b = opt->use_sgemm_convolution;
          unique0x10001a0c = opt->use_int8_inference;
          unique0x10001a0d = opt->use_vulkan_compute;
          pAStack_218 = *(Allocator **)&opt->use_bf16_storage;
          _iStack_210 = *(undefined8 *)&opt->vulkan_device_index;
          _iStack_208 = *(undefined8 *)&opt->flush_denormals;
          _iStack_200 = *(undefined8 *)&opt->use_winograd43_convolution;
          pAStack_230 = opt->workspace_allocator;
          convert_packing(&local_2e8,(Mat *)&opt_q,uVar46,(Option *)&top_rescale);
          if (opt_q._0_8_ != 0) {
            uVar42 = uVar32 & 0xffffffff;
            if ((long)(int)opt_q._56_4_ * sVar11 != 0) goto LAB_003a5db7;
          }
          iVar21 = -100;
        }
        else {
LAB_003a5db7:
          piVar5 = top_blob->refcount;
          _top_rescale = top_blob->data;
          pAStack_230 = (Allocator *)top_blob->refcount;
          pAStack_228 = (Allocator *)top_blob->elemsize;
          iStack_220 = top_blob->elempack;
          pAStack_218 = top_blob->allocator;
          iStack_210 = top_blob->dims;
          iStack_20c = top_blob->w;
          iStack_208 = top_blob->h;
          iStack_204 = top_blob->d;
          iStack_200 = top_blob->c;
          local_1f8 = top_blob->cstep;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          if (_elempack_00 < _elempack) {
            local_300 = (byte)uVar45;
            Mat::create((Mat *)&top_rescale,iVar28,iVar39,
                        (this->super_ConvolutionDepthWise).num_output / (int)_elempack_00,
                        (ulong)((byte)((ushort)uVar47 / (ushort)local_300) * _elempack_00),
                        _elempack_00,opt->workspace_allocator);
            iVar21 = -100;
            if (_top_rescale != (void *)0x0) {
              uVar42 = uVar32 & 0xffffffff;
              if ((long)iStack_200 * local_1f8 != 0) goto LAB_003a5e92;
            }
          }
          else {
LAB_003a5e92:
            iVar43 = 0;
            iVar24 = 0;
            lVar31 = 0;
            do {
              OVar18 = opt_q;
              if ((this->super_ConvolutionDepthWise).group <= lVar31) {
                if (_elempack_00 < _elempack) {
                  convert_packing((Mat *)&top_rescale,top_blob,_elempack,opt);
                  iVar21 = -100;
                  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
                  break;
                }
                else if ((Mat *)&top_rescale != top_blob) {
                  if (pAStack_230 != (Allocator *)0x0) {
                    LOCK();
                    *(int *)&pAStack_230->_vptr_Allocator =
                         *(int *)&pAStack_230->_vptr_Allocator + 1;
                    UNLOCK();
                  }
                  piVar5 = top_blob->refcount;
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (top_blob->allocator == (Allocator *)0x0) {
                        free(top_blob->data);
                      }
                      else {
                        (*top_blob->allocator->_vptr_Allocator[3])();
                      }
                    }
                  }
                  top_blob->data = _top_rescale;
                  top_blob->refcount = (int *)pAStack_230;
                  top_blob->elemsize = (size_t)pAStack_228;
                  top_blob->elempack = iStack_220;
                  top_blob->allocator = pAStack_218;
                  top_blob->dims = iStack_210;
                  top_blob->w = iStack_20c;
                  top_blob->h = iStack_208;
                  top_blob->d = iStack_204;
                  top_blob->c = iStack_200;
                  top_blob->cstep = local_1f8;
                }
                iVar21 = 0;
                break;
              }
              local_188 = (int)uVar42 / (int)uVar46;
              _scale_out = (void *)((long)(iVar43 / (int)uVar46) * sVar11 *
                                    (long)opt_q.workspace_allocator + opt_q._0_8_);
              local_1b8 = (int *)0x0;
              local_1b0 = opt_q.workspace_allocator;
              local_1a8 = opt_q.openmp_blocktime;
              local_1a0 = (long *)opt_q._32_8_;
              uVar17 = opt_q._40_8_;
              uVar14 = opt_q._48_8_;
              local_180 = ((long)(int)opt_q._52_4_ * (long)opt_q.workspace_allocator *
                           (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_ + 0xfU &
                          0xfffffffffffffff0) / (ulong)opt_q.workspace_allocator;
              opt_q.vulkan_device_index = (int)uVar17;
              opt_q.use_reserved_1 = SUB81(uVar17,4);
              opt_q.use_image_storage = SUB81(uVar17,5);
              opt_q.use_tensor_storage = SUB81(uVar17,6);
              opt_q.use_reserved_2 = SUB81(uVar17,7);
              local_198 = opt_q.vulkan_device_index;
              bStack_194 = opt_q.use_reserved_1;
              bStack_193 = opt_q.use_image_storage;
              bStack_192 = opt_q.use_tensor_storage;
              bStack_191 = opt_q.use_reserved_2;
              opt_q.flush_denormals = (int)uVar14;
              opt_q.use_local_pool_allocator = SUB81(uVar14,4);
              opt_q.use_shader_local_memory = SUB81(uVar14,5);
              opt_q.use_cooperative_matrix = SUB81(uVar14,6);
              opt_q.use_winograd23_convolution = SUB81(uVar14,7);
              iStack_190 = opt_q.flush_denormals;
              bStack_18c = opt_q.use_local_pool_allocator;
              bStack_18b = opt_q.use_shader_local_memory;
              bStack_18a = opt_q.use_cooperative_matrix;
              bStack_189 = opt_q.use_winograd23_convolution;
              m_1.c = (int)uVar44 / (int)_elempack_00;
              m_1.data = (void *)((long)(iVar24 / (int)_elempack_00) * local_1f8 * (long)pAStack_228
                                 + (long)_top_rescale);
              m_1.refcount = (int *)0x0;
              m_1.elemsize = (size_t)pAStack_228;
              m_1.elempack = iStack_220;
              m_1.allocator = pAStack_218;
              m_1.cstep = ((long)iStack_204 * (long)pAStack_228 *
                           (long)iStack_208 * (long)iStack_20c + 0xfU & 0xfffffffffffffff0) /
                          (ulong)pAStack_228;
              m_1.dims = iStack_210;
              m_1.w = iStack_20c;
              m_1.h = iStack_208;
              m_1.d = iStack_204;
              pLVar10 = (this->group_ops).
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar31];
              opt_g.lightmode = opt->lightmode;
              opt_g.use_shader_pack8 = opt->use_shader_pack8;
              opt_g.use_subgroup_ops = opt->use_subgroup_ops;
              opt_g.use_reserved_0 = opt->use_reserved_0;
              opt_g.num_threads = opt->num_threads;
              opt_g.workspace_allocator = opt->workspace_allocator;
              opt_g.openmp_blocktime = opt->openmp_blocktime;
              opt_g.use_winograd_convolution = opt->use_winograd_convolution;
              opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
              opt_g.use_int8_inference = opt->use_int8_inference;
              opt_g.use_vulkan_compute = opt->use_vulkan_compute;
              opt_g.use_bf16_storage = opt->use_bf16_storage;
              opt_g.use_fp16_packed = opt->use_fp16_packed;
              opt_g.use_fp16_storage = opt->use_fp16_storage;
              opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
              opt_g.use_int8_packed = opt->use_int8_packed;
              opt_g.use_int8_storage = opt->use_int8_storage;
              opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
              opt_g.use_packing_layout = opt->use_packing_layout;
              opt_g.vulkan_device_index = opt->vulkan_device_index;
              opt_g.use_reserved_1 = opt->use_reserved_1;
              opt_g.use_image_storage = opt->use_image_storage;
              opt_g.use_tensor_storage = opt->use_tensor_storage;
              opt_g.use_reserved_2 = opt->use_reserved_2;
              opt_g.flush_denormals = opt->flush_denormals;
              opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
              opt_g.use_shader_local_memory = opt->use_shader_local_memory;
              opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
              opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
              opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
              opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
              opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
              opt_g.use_fp16_uniform = opt->use_fp16_uniform;
              opt_g.use_int8_uniform = opt->use_int8_uniform;
              opt_g.use_reserved_9 = opt->use_reserved_9;
              opt_g.use_reserved_10 = opt->use_reserved_10;
              opt_g.use_reserved_11 = opt->use_reserved_11;
              opt_g.blob_allocator = pAStack_218;
              opt_q = OVar18;
              iVar21 = (*pLVar10->_vptr_Layer[7])(pLVar10,&scale_out,&m_1,&opt_g);
              if (m_1.refcount != (int *)0x0) {
                LOCK();
                *m_1.refcount = *m_1.refcount + -1;
                UNLOCK();
                if (*m_1.refcount == 0) {
                  if (m_1.allocator == (Allocator *)0x0) {
                    free(m_1.data);
                  }
                  else {
                    (*(m_1.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              if (local_1b8 != (int *)0x0) {
                LOCK();
                *local_1b8 = *local_1b8 + -1;
                UNLOCK();
                if (*local_1b8 == 0) {
                  if (local_1a0 == (long *)0x0) {
                    free(_scale_out);
                  }
                  else {
                    (**(code **)(*local_1a0 + 0x18))();
                  }
                }
              }
              lVar31 = lVar31 + 1;
              iVar24 = iVar24 + uVar44;
              iVar43 = iVar43 + (int)uVar32;
              uVar42 = local_340;
            } while (iVar21 == 0);
          }
          if (pAStack_230 != (Allocator *)0x0) {
            LOCK();
            *(int *)&pAStack_230->_vptr_Allocator = *(int *)&pAStack_230->_vptr_Allocator + -1;
            UNLOCK();
            if (*(int *)&pAStack_230->_vptr_Allocator == 0) {
              if (pAStack_218 == (Allocator *)0x0) {
                free(_top_rescale);
              }
              else {
                (*pAStack_218->_vptr_Allocator[3])();
              }
            }
          }
        }
        if (opt_q.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
            if (opt_q._32_8_ == 0) {
              free((void *)opt_q._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_2e8.allocator == (Allocator *)0x0) {
        free(local_2e8.data);
      }
      else {
        (*(local_2e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_003a71c8:
  if (local_178.refcount != (int *)0x0) {
    LOCK();
    *local_178.refcount = *local_178.refcount + -1;
    UNLOCK();
    if (*local_178.refcount == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        free(local_178.data);
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar21;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}